

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void __thiscall LiteScript::State::GarbageCollector(State *this,offset_in_Memory_to_subr caller)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  Variable *pVVar5;
  const_reference this_00;
  offset_in_Memory_to_subr in_RDX;
  uint local_13c;
  uint sz_1;
  uint i_5;
  Variable local_128;
  uint local_118;
  uint local_114;
  uint sz;
  uint i_4;
  offset_in_Memory_to_subr local_108;
  Variable local_100;
  uint local_f0;
  uint local_ec;
  uint sz_i_3;
  uint i_3;
  offset_in_Memory_to_subr local_e0;
  Variable local_d8;
  uint local_c8;
  uint local_c4;
  uint sz_i_2;
  uint i_2;
  offset_in_Memory_to_subr local_b8;
  Variable local_b0;
  uint local_a0;
  uint local_9c;
  uint sz_j_1;
  uint j_1;
  uint sz_i_1;
  uint i_1;
  offset_in_Memory_to_subr local_88;
  Variable local_80;
  uint local_6c;
  uint local_68;
  uint sz_j;
  uint j;
  uint sz_i;
  uint i;
  offset_in_Memory_to_subr local_50;
  offset_in_Memory_to_subr local_48;
  Variable local_40;
  offset_in_Memory_to_subr local_30;
  offset_in_Memory_to_subr caller_local;
  State *local_20;
  State *this_local;
  
  local_30 = caller;
  caller_local = in_RDX;
  local_20 = this;
  this_local = (State *)caller;
  Variable::Variable(&local_40,&this->nsp_global);
  local_48 = caller_local;
  local_50 = local_30;
  Variable::GarbageCollector(&local_40,local_30);
  Variable::~Variable(&local_40);
  j = 0;
  sVar1 = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size(&this->args_tmp);
  sz_j = (uint)sVar1;
  for (; j < sz_j; j = j + 1) {
    local_68 = 0;
    pvVar2 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[](&this->args_tmp,(ulong)j);
    sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar2);
    local_6c = (uint)sVar1;
    for (; local_68 < local_6c; local_68 = local_68 + 1) {
      pvVar2 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[](&this->args_tmp,(ulong)j);
      pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                         (pvVar2,(ulong)local_68);
      Variable::Variable(&local_80,pvVar3);
      local_88 = caller_local;
      _sz_i_1 = local_30;
      Variable::GarbageCollector(&local_80,local_30);
      Variable::~Variable(&local_80);
    }
  }
  j_1 = 0;
  sVar1 = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size(&this->args_def);
  sz_j_1 = (uint)sVar1;
  for (; j_1 < sz_j_1; j_1 = j_1 + 1) {
    local_9c = 0;
    pvVar2 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[](&this->args_def,(ulong)j_1);
    sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar2);
    local_a0 = (uint)sVar1;
    for (; local_9c < local_a0; local_9c = local_9c + 1) {
      pvVar2 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[](&this->args_def,(ulong)j_1);
      pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                         (pvVar2,(ulong)local_9c);
      Variable::Variable(&local_b0,pvVar3);
      local_b8 = caller_local;
      _sz_i_2 = local_30;
      Variable::GarbageCollector(&local_b0,local_30);
      Variable::~Variable(&local_b0);
    }
  }
  local_c4 = 0;
  sVar1 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size(&this->ths);
  local_c8 = (uint)sVar1;
  for (; local_c4 < local_c8; local_c4 = local_c4 + 1) {
    pvVar4 = std::
             vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ::operator[](&this->ths,(ulong)local_c4);
    if ((*pvVar4->isNull & 1U) == 0) {
      pvVar4 = std::
               vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ::operator[](&this->ths,(ulong)local_c4);
      pVVar5 = Nullable<LiteScript::Variable>::operator*(pvVar4);
      Variable::Variable(&local_d8,pVVar5);
      local_e0 = caller_local;
      _sz_i_3 = local_30;
      Variable::GarbageCollector(&local_d8,local_30);
      Variable::~Variable(&local_d8);
    }
  }
  local_ec = 0;
  sVar1 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size(&this->rets);
  local_f0 = (uint)sVar1;
  for (; local_ec < local_f0; local_ec = local_ec + 1) {
    pvVar4 = std::
             vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ::operator[](&this->rets,(ulong)local_ec);
    if ((*pvVar4->isNull & 1U) == 0) {
      pvVar4 = std::
               vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ::operator[](&this->rets,(ulong)local_ec);
      pVVar5 = Nullable<LiteScript::Variable>::operator*(pvVar4);
      Variable::Variable(&local_100,pVVar5);
      local_108 = caller_local;
      _sz = local_30;
      Variable::GarbageCollector(&local_100,local_30);
      Variable::~Variable(&local_100);
    }
  }
  local_114 = 0;
  sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&this->op_lifo);
  local_118 = (uint)sVar1;
  for (; local_114 < local_118; local_114 = local_114 + 1) {
    pvVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                       (&this->op_lifo,(ulong)local_114);
    Variable::Variable(&local_128,pvVar3);
    Variable::GarbageCollector(&local_128,local_30);
    Variable::~Variable(&local_128);
  }
  local_13c = 0;
  sVar1 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::size(&this->nsp_lifo);
  for (; local_13c < (uint)sVar1; local_13c = local_13c + 1) {
    this_00 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::operator[]
                        (&this->nsp_lifo,(ulong)local_13c);
    Namer::GarbageCollector(this_00,local_30);
  }
  return;
}

Assistant:

void LiteScript::State::GarbageCollector(bool (Memory::*caller)(unsigned int)) const {
    Variable(this->nsp_global).GarbageCollector(caller);
    for (unsigned int i = 0, sz_i = this->args_tmp.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_tmp[i].size(); j < sz_j; j++)
            Variable(this->args_tmp[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->args_def.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_def[i].size(); j < sz_j; j++)
            Variable(this->args_def[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->ths.size(); i < sz_i; i++) {
        if (!this->ths[i].isNull)
            Variable(*this->ths[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->rets.size(); i < sz_i; i++) {
        if (!this->rets[i].isNull)
            Variable(*this->rets[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz = this->op_lifo.size(); i < sz; i++)
        Variable(this->op_lifo[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = this->nsp_lifo.size(); i < sz; i++)
        this->nsp_lifo[i].GarbageCollector(caller);
}